

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Block::SerializeBlockHeader(ByteData *__return_storage_ptr__,Block *this)

{
  ByteData local_80;
  ByteData local_68;
  undefined1 local_40 [8];
  Serializer obj;
  Block *this_local;
  
  obj._32_8_ = this;
  Serializer::Serializer((Serializer *)local_40);
  Serializer::AddDirectNumber((Serializer *)local_40,(this->header_).version);
  BlockHash::GetData(&local_68,&(this->header_).prev_block_hash);
  Serializer::AddDirectBytes((Serializer *)local_40,&local_68);
  ByteData::~ByteData((ByteData *)0x756aaf);
  BlockHash::GetData(&local_80,&(this->header_).merkle_root_hash);
  Serializer::AddDirectBytes((Serializer *)local_40,&local_80);
  ByteData::~ByteData((ByteData *)0x756add);
  Serializer::AddDirectNumber((Serializer *)local_40,(this->header_).time);
  Serializer::AddDirectNumber((Serializer *)local_40,(this->header_).bits);
  Serializer::AddDirectNumber((Serializer *)local_40,(this->header_).nonce);
  Serializer::Output(__return_storage_ptr__,(Serializer *)local_40);
  Serializer::~Serializer((Serializer *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData Block::SerializeBlockHeader() const {
  Serializer obj;
  obj.AddDirectNumber(header_.version);
  obj.AddDirectBytes(header_.prev_block_hash.GetData());
  obj.AddDirectBytes(header_.merkle_root_hash.GetData());
  obj.AddDirectNumber(header_.time);
  obj.AddDirectNumber(header_.bits);
  obj.AddDirectNumber(header_.nonce);
  return obj.Output();
}